

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::UDFWrapper::
CreateAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
          (string *name,LogicalType *ret_type,LogicalType *input_type_a,LogicalType *input_type_b)

{
  bool bVar1;
  runtime_error *prVar2;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *unaff_retaddr;
  string *in_stack_00000008;
  LogicalType *in_stack_ffffffffffffffc8;
  AggregateFunction *input_type_a_00;
  
  input_type_a_00 = in_RDI;
  bVar1 = TypesMatch<double>(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"The return argument don\'t match!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = TypesMatch<double>(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"The first input argument don\'t match!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = TypesMatch<double>(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"The second input argument don\'t match!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CreateBinaryAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
            (in_stack_00000008,unaff_retaddr,(LogicalType *)input_type_a_00,in_RSI);
  return in_RDI;
}

Assistant:

inline static AggregateFunction CreateAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                        const LogicalType &input_type_a,
	                                                        const LogicalType &input_type_b) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The return argument don't match!");
		}

		if (!TypesMatch<TA>(input_type_a)) {
			throw std::runtime_error("The first input argument don't match!");
		}

		if (!TypesMatch<TB>(input_type_b)) {
			throw std::runtime_error("The second input argument don't match!");
		} // LCOV_EXCL_STOP

		return CreateBinaryAggregateFunction<UDF_OP, STATE, TR, TA, TB>(name, ret_type, input_type_a, input_type_b);
	}